

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RandCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandCaseItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,StatementSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  RandCaseItemSyntax *pRVar6;
  
  pRVar6 = (RandCaseItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RandCaseItemSyntax *)this->endPtr < pRVar6 + 1) {
    pRVar6 = (RandCaseItemSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pRVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pRVar6->super_SyntaxNode).kind = RandCaseItem;
  (pRVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pRVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pRVar6->expr).ptr = args;
  (pRVar6->colon).kind = TVar2;
  (pRVar6->colon).field_0x2 = uVar3;
  (pRVar6->colon).numFlags = (NumericTokenFlags)NVar4.raw;
  (pRVar6->colon).rawLen = uVar5;
  (pRVar6->colon).info = pIVar1;
  (pRVar6->statement).ptr = args_2;
  (args->super_SyntaxNode).parent = &pRVar6->super_SyntaxNode;
  (args_2->super_SyntaxNode).parent = &pRVar6->super_SyntaxNode;
  return pRVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }